

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uppity.c
# Opt level: O1

_Bool longoptarg(char *arg,char *expected,char **val,int *argcp,char ***argvp)

{
  char **ppcVar1;
  _Bool _Var2;
  int iVar3;
  size_t sVar4;
  char cVar5;
  char *pcVar6;
  
  sVar4 = strlen(expected);
  sVar4 = (size_t)(int)sVar4;
  iVar3 = bcmp(arg,expected,sVar4);
  if (iVar3 == 0) {
    if (arg[sVar4] == '\0') {
      iVar3 = *argcp;
      *argcp = iVar3 + -1;
      if (iVar3 < 2) {
        longoptarg_cold_1();
        iVar3 = strcmp(expected,"none");
        if (iVar3 == 0) {
          cVar5 = '\x01';
        }
        else {
          iVar3 = strcmp(expected,"tis");
          if (iVar3 == 0) {
            cVar5 = '\x10';
          }
          else {
            iVar3 = strcmp(expected,"cryptocard");
            cVar5 = ' ';
            if (iVar3 != 0) {
              iVar3 = strcmp(expected,"ccard");
              if (iVar3 != 0) {
                iVar3 = strcmp(expected,"keyboard-interactive");
                cVar5 = '\b';
                if (iVar3 != 0) {
                  iVar3 = strcmp(expected,"k-i");
                  if (iVar3 != 0) {
                    iVar3 = strcmp(expected,"kbdint");
                    if (iVar3 != 0) {
                      iVar3 = strcmp(expected,"ki");
                      if (iVar3 != 0) {
                        iVar3 = strcmp(expected,"publickey");
                        cVar5 = '\x04';
                        if (iVar3 != 0) {
                          iVar3 = strcmp(expected,"pubkey");
                          if (iVar3 != 0) {
                            iVar3 = strcmp(expected,"pk");
                            if (iVar3 != 0) {
                              iVar3 = strcmp(expected,"password");
                              if (iVar3 == 0) {
                                cVar5 = '\x02';
                              }
                              else {
                                iVar3 = strcmp(expected,"pw");
                                cVar5 = (iVar3 == 0) * '\x02';
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        return (_Bool)cVar5;
      }
      ppcVar1 = *argvp;
      *argvp = ppcVar1 + 1;
      pcVar6 = ppcVar1[1];
    }
    else {
      if (arg[sVar4] != '=') goto LAB_001109df;
      pcVar6 = arg + sVar4 + 1;
    }
    *val = pcVar6;
    _Var2 = true;
  }
  else {
LAB_001109df:
    _Var2 = false;
  }
  return _Var2;
}

Assistant:

static bool longoptarg(const char *arg, const char *expected,
                       const char **val, int *argcp, char ***argvp)
{
    int len = strlen(expected);
    if (memcmp(arg, expected, len))
        return false;
    if (arg[len] == '=') {
        *val = arg + len + 1;
        return true;
    } else if (arg[len] == '\0') {
        if (--*argcp > 0) {
            *val = *++*argvp;
            return true;
        } else {
            fprintf(stderr, "%s: option %s expects an argument\n",
                    appname, expected);
            exit(1);
        }
    }
    return false;
}